

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O2

void res0_pack(vorbis_info_residue *vr,oggpack_buffer *opb)

{
  int iVar1;
  unsigned_long value;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  oggpack_write(opb,*vr,0x18);
  oggpack_write(opb,*(unsigned_long *)((long)vr + 8),0x18);
  oggpack_write(opb,(long)*(int *)((long)vr + 0x10) - 1,0x18);
  oggpack_write(opb,(long)*(int *)((long)vr + 0x14) - 1,6);
  oggpack_write(opb,(long)*(int *)((long)vr + 0x1c),8);
  uVar4 = 0;
  for (lVar2 = 0; lVar2 < *(int *)((long)vr + 0x14); lVar2 = lVar2 + 1) {
    iVar1 = ov_ilog(*(ogg_uint32_t *)((long)vr + lVar2 * 4 + 0x20));
    value = (unsigned_long)*(int *)((long)vr + lVar2 * 4 + 0x20);
    if (iVar1 < 4) {
      iVar1 = 4;
    }
    else {
      oggpack_write(opb,value,3);
      oggpack_write(opb,1,1);
      value = (unsigned_long)(*(int *)((long)vr + lVar2 * 4 + 0x20) >> 3);
      iVar1 = 5;
    }
    oggpack_write(opb,value,iVar1);
    iVar1 = icount(*(uint *)((long)vr + lVar2 * 4 + 0x20));
    uVar4 = uVar4 + iVar1;
  }
  uVar3 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar3;
  }
  for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
    oggpack_write(opb,(long)*(int *)((long)vr + uVar3 * 4 + 0x120),8);
  }
  return;
}

Assistant:

void res0_pack(vorbis_info_residue *vr,oggpack_buffer *opb){
  vorbis_info_residue0 *info=(vorbis_info_residue0 *)vr;
  int j,acc=0;
  oggpack_write(opb,info->begin,24);
  oggpack_write(opb,info->end,24);

  oggpack_write(opb,info->grouping-1,24);  /* residue vectors to group and
                                             code with a partitioned book */
  oggpack_write(opb,info->partitions-1,6); /* possible partition choices */
  oggpack_write(opb,info->groupbook,8);  /* group huffman book */

  /* secondstages is a bitmask; as encoding progresses pass by pass, a
     bitmask of one indicates this partition class has bits to write
     this pass */
  for(j=0;j<info->partitions;j++){
    if(ov_ilog(info->secondstages[j])>3){
      /* yes, this is a minor hack due to not thinking ahead */
      oggpack_write(opb,info->secondstages[j],3);
      oggpack_write(opb,1,1);
      oggpack_write(opb,info->secondstages[j]>>3,5);
    }else
      oggpack_write(opb,info->secondstages[j],4); /* trailing zero */
    acc+=icount(info->secondstages[j]);
  }
  for(j=0;j<acc;j++)
    oggpack_write(opb,info->booklist[j],8);

}